

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O2

int __thiscall sjtu::TrainManager::init(TrainManager *this,EVP_PKEY_CTX *ctx)

{
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *pBVar1;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar2;
  FileManager<sjtu::TrainManager::stationNameType> *pFVar3;
  DynamicFileManager<sjtu::trainType> *pDVar4;
  string *this_00;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  ofstream outfile;
  
  if ((int)ctx == 0) {
    pBVar1 = (BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *)
             operator_new(0x18);
    std::__cxx11::string::string((string *)&local_2b0,"StationBpTree.dat",(allocator *)&outfile);
    BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::BplusTree
              (pBVar1,&local_2b0,0x100);
    this->StationBpTree = pBVar1;
    std::__cxx11::string::~string((string *)&local_2b0);
    pBVar2 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
             operator_new(0x18);
    std::__cxx11::string::string((string *)&local_2d0,"TrainBpTree.dat",(allocator *)&outfile);
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::BplusTree
              (pBVar2,&local_2d0,0x100);
    this->TrainBpTree = pBVar2;
    std::__cxx11::string::~string((string *)&local_2d0);
    pDVar4 = (DynamicFileManager<sjtu::trainType> *)operator_new(0x228);
    std::__cxx11::string::string((string *)&local_2f0,"TrainFile.dat",(allocator *)&outfile);
    DynamicFileManager<sjtu::trainType>::DynamicFileManager(pDVar4,&local_2f0,0x10);
    this->TrainFile = pDVar4;
    std::__cxx11::string::~string((string *)&local_2f0);
    pFVar3 = (FileManager<sjtu::TrainManager::stationNameType> *)operator_new(0x228);
    std::__cxx11::string::string((string *)&local_310,"StationFile.dat",(allocator *)&outfile);
    FileManager<sjtu::TrainManager::stationNameType>::FileManager(pFVar3,&local_310,0x20);
    this->StationFile = pFVar3;
    this_00 = &local_310;
  }
  else {
    pBVar1 = this->StationBpTree;
    std::__cxx11::string::string(local_230,"StationBpTree.dat",(allocator *)&outfile);
    BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::init
              (pBVar1,(EVP_PKEY_CTX *)local_230);
    std::__cxx11::string::~string(local_230);
    pBVar2 = this->TrainBpTree;
    std::__cxx11::string::string(local_250,"TrainBpTree.dat",(allocator *)&outfile);
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::init
              (pBVar2,(EVP_PKEY_CTX *)local_250);
    std::__cxx11::string::~string(local_250);
    pDVar4 = this->TrainFile;
    std::__cxx11::string::string(local_270,"TrainFile.dat",(allocator *)&outfile);
    (**(pDVar4->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base)
              (pDVar4,local_270,0x10,1);
    std::__cxx11::string::~string(local_270);
    pFVar3 = this->StationFile;
    std::__cxx11::string::string((string *)&local_290,"StationFile.dat",(allocator *)&outfile);
    (**(pFVar3->super_FileManager_Base<sjtu::TrainManager::stationNameType>)._vptr_FileManager_Base)
              (pFVar3,&local_290,0x20,1);
    this_00 = &local_290;
  }
  std::__cxx11::string::~string((string *)this_00);
  pDVar4 = this->TrainFile;
  if ((pDVar4->super_FileManager_Base<sjtu::trainType>).is_newfile == true) {
    std::ofstream::ofstream(&outfile,"Bitset.dat",_S_out|_S_bin);
    std::ofstream::close();
    pDVar4 = (DynamicFileManager<sjtu::trainType> *)std::ofstream::~ofstream(&outfile);
  }
  return (int)pDVar4;
}

Assistant:

void init(bool is_reset = false)
		{
			if (is_reset)
			{
				StationBpTree -> init("StationBpTree.dat" , StationBpTree_cache_size , true);
				TrainBpTree -> init("TrainBpTree.dat" , TrainBpTree_cache_size , true);
				TrainFile -> init("TrainFile.dat" , TrainFile_cache_size , true);
				StationFile -> init("StationFile.dat" , StationFile_cache_size , true);
			}
			else
			{
				StationBpTree = new BplusTree<StringHasher::hashType , unsigned int> ("StationBpTree.dat" , StationBpTree_cache_size);
				TrainBpTree = new BplusTree<StringHasher::hashType , locType> ("TrainBpTree.dat" , TrainBpTree_cache_size);
				TrainFile = new DynamicFileManager<trainType> ("TrainFile.dat" , TrainFile_cache_size);
				StationFile = new FileManager<stationNameType> ("StationFile.dat" , StationFile_cache_size);
			}
			if (TrainFile -> is_newfile)
			{
				std::ofstream outfile("Bitset.dat" , std::ios_base::out | std::ios_base::binary);
				outfile.close();
			}
		}